

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryReporterPluginTest.cpp
# Opt level: O2

void __thiscall
TEST_MemoryReporterPlugin_newArrayAllocationsAreReportedTest_Test::testBody
          (TEST_MemoryReporterPlugin_newArrayAllocationsAreReportedTest_Test *this)

{
  MemoryReporterPluginUnderTest *pMVar1;
  int iVar2;
  MockSupport *pMVar3;
  undefined4 extraout_var;
  long *plVar4;
  MemoryReportAllocator *pMVar5;
  undefined4 extraout_var_00;
  TestMemoryAllocator *pTVar6;
  undefined4 extraout_var_01;
  SimpleString local_60;
  SimpleString local_50;
  SimpleString local_40;
  SimpleString local_30;
  SimpleString local_20;
  
  SimpleString::SimpleString(&local_60,"formatter");
  pMVar3 = mock(&local_60,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_20,"report_alloc_memory");
  iVar2 = (*pMVar3->_vptr_MockSupport[3])(pMVar3,&local_20);
  SimpleString::SimpleString(&local_30,"result");
  plVar4 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0xa0))
                             ((long *)CONCAT44(extraout_var,iVar2),&local_30,
                              (this->super_TEST_GROUP_CppUTestGroupMemoryReporterPlugin).result);
  SimpleString::SimpleString(&local_40,"TestMemoryAllocator");
  SimpleString::SimpleString(&local_50,"allocator");
  pMVar5 = MemoryReporterPlugin::getNewArrayAllocator
                     (&((this->super_TEST_GROUP_CppUTestGroupMemoryReporterPlugin).reporter)->
                       super_MemoryReporterPlugin);
  (**(code **)(*plVar4 + 0x28))(plVar4,&local_40,&local_50,pMVar5);
  SimpleString::~SimpleString(&local_50);
  SimpleString::~SimpleString(&local_40);
  SimpleString::~SimpleString(&local_30);
  SimpleString::~SimpleString(&local_20);
  SimpleString::~SimpleString(&local_60);
  SimpleString::SimpleString(&local_60,"formatter");
  pMVar3 = mock(&local_60,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_20,"report_free_memory");
  iVar2 = (*pMVar3->_vptr_MockSupport[3])(pMVar3,&local_20);
  SimpleString::SimpleString(&local_30,"result");
  plVar4 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0xa0))
                             ((long *)CONCAT44(extraout_var_00,iVar2),&local_30,
                              (this->super_TEST_GROUP_CppUTestGroupMemoryReporterPlugin).result);
  SimpleString::SimpleString(&local_40,"TestMemoryAllocator");
  SimpleString::SimpleString(&local_50,"allocator");
  pMVar5 = MemoryReporterPlugin::getNewArrayAllocator
                     (&((this->super_TEST_GROUP_CppUTestGroupMemoryReporterPlugin).reporter)->
                       super_MemoryReporterPlugin);
  (**(code **)(*plVar4 + 0x28))(plVar4,&local_40,&local_50,pMVar5);
  SimpleString::~SimpleString(&local_50);
  SimpleString::~SimpleString(&local_40);
  SimpleString::~SimpleString(&local_30);
  SimpleString::~SimpleString(&local_20);
  SimpleString::~SimpleString(&local_60);
  SimpleString::SimpleString(&local_60,"formatter");
  pMVar3 = mock(&local_60,(MockFailureReporter *)0x0);
  (*pMVar3->_vptr_MockSupport[0x24])(pMVar3);
  SimpleString::~SimpleString(&local_60);
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMemoryReporterPlugin).reporter;
  (*(pMVar1->super_MemoryReporterPlugin).super_TestPlugin._vptr_TestPlugin[2])
            (pMVar1,(this->super_TEST_GROUP_CppUTestGroupMemoryReporterPlugin).test,
             (this->super_TEST_GROUP_CppUTestGroupMemoryReporterPlugin).result);
  pTVar6 = getCurrentNewArrayAllocator();
  iVar2 = (*pTVar6->_vptr_TestMemoryAllocator[8])(pTVar6,100);
  pTVar6 = getCurrentNewArrayAllocator();
  (*pTVar6->_vptr_TestMemoryAllocator[3])(pTVar6,CONCAT44(extraout_var_01,iVar2),100,"unknown",1);
  return;
}

Assistant:

TEST(MemoryReporterPlugin, newArrayAllocationsAreReportedTest)
{
    mock("formatter").expectOneCall("report_alloc_memory").withParameter("result", result).withParameterOfType("TestMemoryAllocator", "allocator", reporter->getNewArrayAllocator());
    mock("formatter").expectOneCall("report_free_memory").withParameter("result", result).withParameterOfType("TestMemoryAllocator", "allocator", reporter->getNewArrayAllocator());
    mock("formatter").ignoreOtherCalls();

    reporter->preTestAction(*test, *result);
    char *memory = getCurrentNewArrayAllocator()->allocMemoryLeakNode(100);
    getCurrentNewArrayAllocator()->free_memory(memory, 100, "unknown", 1);
}